

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O2

int decode_dec(BIGNUM *bn,char *in,int in_len)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong w;
  
  iVar1 = (int)((long)in_len % 0x13);
  uVar3 = (ulong)(0x13 - iVar1);
  if (iVar1 == 0) {
    uVar3 = (long)in_len % 0x13 & 0xffffffff;
  }
  uVar5 = 0;
  uVar4 = (ulong)(uint)in_len;
  if (in_len < 1) {
    uVar4 = uVar5;
  }
  w = 0;
  do {
    if (uVar4 == uVar5) {
      return 1;
    }
    w = (w * 10 + (long)in[uVar5]) - 0x30;
    uVar2 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar2;
    if (uVar2 == 0x13) {
      iVar1 = BN_mul_word((BIGNUM *)bn,10000000000000000000);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = BN_add_word((BIGNUM *)bn,w);
      uVar3 = 0;
      if (iVar1 == 0) {
        return 0;
      }
      w = 0;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static int decode_dec(BIGNUM *bn, const char *in, int in_len) {
  int i, j;
  BN_ULONG l = 0;

  // Decode |BN_DEC_NUM| digits at a time.
  j = BN_DEC_NUM - (in_len % BN_DEC_NUM);
  if (j == BN_DEC_NUM) {
    j = 0;
  }
  l = 0;
  for (i = 0; i < in_len; i++) {
    l *= 10;
    l += in[i] - '0';
    if (++j == BN_DEC_NUM) {
      if (!BN_mul_word(bn, BN_DEC_CONV) || !BN_add_word(bn, l)) {
        return 0;
      }
      l = 0;
      j = 0;
    }
  }
  return 1;
}